

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O0

bool asmjit::v1_14::a64::pickFpOpcode
               (Vec *reg,uint32_t sOp,uint32_t sHf,uint32_t vOp,uint32_t vHf,Opcode *opcode,
               uint32_t *szOut)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint *in_RDI;
  uint in_R8D;
  Opcode *in_R9;
  uint32_t sz_1;
  uint32_t q;
  uint32_t sz;
  uint32_t local_50;
  uint local_4c;
  uint32_t local_48;
  uint local_44;
  uint32_t *local_10;
  uint32_t *local_8;
  
  if ((*in_RDI & 0x7000) == 0) {
    uVar1 = diff((RegType)(*in_RDI >> 3) & kMaxValue,kARM_VecH);
    if (uVar1 < 3) {
      local_44 = pickFpOpcode::szBits[in_EDX].sizeMask;
      local_10 = &local_48;
      if ((local_44 & 1 << ((byte)uVar1 & 0x1f)) != 0) {
        local_48 = uVar1;
        Opcode::reset(in_R9,*(uint *)((ulong)in_EDX * 0x10 + 0x203b04 + (ulong)uVar1 * 4) ^ in_ESI);
        *_q = uVar1;
        return in_ESI != 0;
      }
    }
  }
  else {
    uVar1 = diff((RegType)(*in_RDI >> 3) & kMaxValue,kARM_VecD);
    uVar2 = diff(*in_RDI >> 0xc & (kH2|kB),kH);
    if ((uVar1 < 2) && (uVar2 < 3)) {
      local_4c = pickFpOpcode::szBits[in_R8D].sizeMask;
      local_8 = &local_50;
      if ((local_4c & 1 << ((byte)uVar2 & 0x1f)) != 0) {
        local_50 = uVar2;
        Opcode::reset(in_R9,*(uint *)((ulong)in_R8D * 0x10 + 0x203b04 + (ulong)uVar2 * 4) ^
                            (in_ECX | uVar1 << 0x1e));
        *_q = uVar2;
        return in_ECX != 0;
      }
    }
  }
  return false;
}

Assistant:

static inline bool pickFpOpcode(const Vec& reg, uint32_t sOp, uint32_t sHf, uint32_t vOp, uint32_t vHf, Opcode* opcode, uint32_t* szOut) noexcept {
  static constexpr uint32_t kQBitIndex = 30;

  static const EncodeFpOpcodeBits szBits[InstDB::kHF_Count] = {
    { B(2) | B(1)       , { 0u                           , 0u, B(22) } },
    { B(2) | B(1) | B(0), { 0u                           , 0u, 0u    } },
    { B(2) | B(1) | B(0), { B(23) | B(22)                , 0u, B(22) } },
    { B(2) | B(1) | B(0), { B(22) | B(20) | B(19)        , 0u, B(22) } },
    { B(2) | B(1) | B(0), { B(22) | B(21) | B(15) | B(14), 0u, B(22) } },
    { B(2) | B(1) | B(0), { B(23)                        , 0u, B(22) } }
  };

  if (!reg.hasElementType()) {
    // Scalar operation [HSD].
    uint32_t sz = diff(reg.type(), RegType::kARM_VecH);
    if (sz > 2u || !Support::bitTest(szBits[sHf].sizeMask, sz))
      return false;

    opcode->reset(szBits[sHf].mask[sz] ^ sOp);
    *szOut = sz;
    return sOp != 0;
  }
  else {
    // Vector operation [HSD].
    uint32_t q = diff(reg.type(), RegType::kARM_VecD);
    uint32_t sz = diff(reg.elementType(), VecElementType::kH);

    if (q > 1u || sz > 2u || !Support::bitTest(szBits[vHf].sizeMask, sz))
      return false;

    opcode->reset(szBits[vHf].mask[sz] ^ (vOp | (q << kQBitIndex)));
    *szOut = sz;
    return vOp != 0;
  }
}